

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O2

void __thiscall QDBusListener::populateSignalMap(QDBusListener *this)

{
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  QLatin1StringView latin1_08;
  ChangeSignal local_d0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  DBusKey local_98;
  QArrayDataPointer<char16_t> local_68;
  pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_signalMap;
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  ::clear(this_00);
  qEnvironmentVariable((char *)&local_68);
  if (local_68.size != 0) {
    loadJson(this,(QString *)&local_68);
  }
  if ((this->m_signalMap).c.keys.d.size == 0) {
    latin1.m_data = "org.kde.kdeglobals.KDE";
    latin1.m_size = 0x16;
    QString::QString((QString *)&local_b0,latin1);
    latin1_00.m_data = "widgetStyle";
    latin1_00.m_size = 0xb;
    QString::QString((QString *)&local_c8,latin1_00);
    DBusKey::DBusKey(&local_98,(QString *)&local_b0,(QString *)&local_c8);
    local_d0.provider = Kde;
    local_d0.setting = ApplicationStyle;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_50,this_00,&local_98,&local_d0);
    DBusKey::~DBusKey(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    latin1_01.m_data = "org.kde.kdeglobals.General";
    latin1_01.m_size = 0x1a;
    QString::QString((QString *)&local_b0,latin1_01);
    latin1_02.m_data = "ColorScheme";
    latin1_02.m_size = 0xb;
    QString::QString((QString *)&local_c8,latin1_02);
    DBusKey::DBusKey(&local_98,(QString *)&local_b0,(QString *)&local_c8);
    local_d0.provider = Kde;
    local_d0.setting = Theme;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_50,this_00,&local_98,&local_d0);
    DBusKey::~DBusKey(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    latin1_03.m_data = "org.gnome.desktop.interface";
    latin1_03.m_size = 0x1b;
    QString::QString((QString *)&local_b0,latin1_03);
    latin1_04.m_data = "gtk-theme";
    latin1_04.m_size = 9;
    QString::QString((QString *)&local_c8,latin1_04);
    DBusKey::DBusKey(&local_98,(QString *)&local_b0,(QString *)&local_c8);
    local_d0.provider = Gtk;
    local_d0.setting = Theme;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_50,this_00,&local_98,&local_d0);
    DBusKey::~DBusKey(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    latin1_05.m_data = "org.freedesktop.appearance";
    latin1_05.m_size = 0x1a;
    QString::QString((QString *)&local_b0,latin1_05);
    latin1_06.m_data = "color-scheme";
    latin1_06.m_size = 0xc;
    QString::QString((QString *)&local_c8,latin1_06);
    DBusKey::DBusKey(&local_98,(QString *)&local_b0,(QString *)&local_c8);
    local_d0.provider = Gnome;
    local_d0.setting = ColorScheme;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_50,this_00,&local_98,&local_d0);
    DBusKey::~DBusKey(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    latin1_07.m_data = "org.freedesktop.appearance";
    latin1_07.m_size = 0x1a;
    QString::QString((QString *)&local_b0,latin1_07);
    latin1_08.m_data = "contrast";
    latin1_08.m_size = 8;
    QString::QString((QString *)&local_c8,latin1_08);
    DBusKey::DBusKey(&local_98,(QString *)&local_b0,(QString *)&local_c8);
    local_d0.provider = Gnome;
    local_d0.setting = Contrast;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_50,this_00,&local_98,&local_d0);
    DBusKey::~DBusKey(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    qEnvironmentVariable((char *)&local_98);
    if (local_98.location.d.size != 0) {
      saveJson(this,&local_98.location);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusListener::populateSignalMap()
{
    m_signalMap.clear();
    const QString &loadJsonFile = qEnvironmentVariable("QT_QPA_DBUS_SIGNALS");
    if (!loadJsonFile.isEmpty())
        loadJson(loadJsonFile);
    if (!m_signalMap.isEmpty())
        return;

    m_signalMap.insert(DBusKey("org.kde.kdeglobals.KDE"_L1, "widgetStyle"_L1),
                       ChangeSignal(Provider::Kde, Setting::ApplicationStyle));

    m_signalMap.insert(DBusKey("org.kde.kdeglobals.General"_L1, "ColorScheme"_L1),
                       ChangeSignal(Provider::Kde, Setting::Theme));

    m_signalMap.insert(DBusKey("org.gnome.desktop.interface"_L1, "gtk-theme"_L1),
                       ChangeSignal(Provider::Gtk, Setting::Theme));

    m_signalMap.insert(DBusKey("org.freedesktop.appearance"_L1, "color-scheme"_L1),
                       ChangeSignal(Provider::Gnome, Setting::ColorScheme));

    m_signalMap.insert(DBusKey("org.freedesktop.appearance"_L1, "contrast"_L1),
                       ChangeSignal(Provider::Gnome, Setting::Contrast));

    const QString &saveJsonFile = qEnvironmentVariable("QT_QPA_DBUS_SIGNALS_SAVE");
    if (!saveJsonFile.isEmpty())
        saveJson(saveJsonFile);
}